

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O0

void __thiscall
re2::Prog::ComputeHints
          (Prog *this,vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat,int begin,
          int end)

{
  InstOp IVar1;
  int iVar2;
  reference this_00;
  int *piVar3;
  int local_49c;
  int local_498;
  short local_492;
  int local_490;
  int iStack_48c;
  uint16_t hint;
  int foldhi;
  int foldlo;
  int hi;
  int lo;
  Inst *ip;
  anon_class_32_4_bbdeb633 Recolor;
  int local_450;
  int first;
  int id;
  bool dirty;
  int colors [256];
  undefined1 local_40 [8];
  Bitmap256 splits;
  int end_local;
  int begin_local;
  vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_> *flat_local;
  Prog *this_local;
  
  splits.words_[3]._0_4_ = end;
  splits.words_[3]._4_4_ = begin;
  Bitmap256::Bitmap256((Bitmap256 *)local_40);
  first._3_1_ = 0;
  local_450 = (int)splits.words_[3];
  do {
    if (local_450 < splits.words_[3]._4_4_) {
      return;
    }
    if (local_450 == (int)splits.words_[3]) {
LAB_00372d69:
      if ((first._3_1_ & 1) != 0) {
        first._3_1_ = 0;
        Bitmap256::Clear((Bitmap256 *)local_40);
      }
      Bitmap256::Set((Bitmap256 *)local_40,0xff);
      colors[0xfd] = local_450;
    }
    else {
      this_00 = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::operator[]
                          (flat,(long)local_450);
      IVar1 = Inst::opcode(this_00);
      if (IVar1 != kInstByteRange) goto LAB_00372d69;
      first._3_1_ = 1;
      Recolor.id._4_4_ = (int)splits.words_[3];
      ip = (Inst *)local_40;
      Recolor.splits = (Bitmap256 *)&id;
      Recolor.colors = (int (*) [256])((long)&Recolor.id + 4);
      Recolor.first = &local_450;
      _hi = std::vector<re2::Prog::Inst,_std::allocator<re2::Prog::Inst>_>::operator[]
                      (flat,(long)local_450);
      foldlo = Inst::lo(_hi);
      foldhi = Inst::hi(_hi);
      ComputeHints::anon_class_32_4_bbdeb633::operator()
                ((anon_class_32_4_bbdeb633 *)&ip,foldlo,foldhi);
      iVar2 = Inst::foldcase(_hi);
      if (((iVar2 != 0) && (foldlo < 0x7b)) && (0x60 < foldhi)) {
        iStack_48c = foldlo;
        local_490 = foldhi;
        if (foldlo < 0x61) {
          iStack_48c = 0x61;
        }
        if (0x7a < foldhi) {
          local_490 = 0x7a;
        }
        if (iStack_48c <= local_490) {
          iStack_48c = iStack_48c + -0x20;
          local_490 = local_490 + -0x20;
          ComputeHints::anon_class_32_4_bbdeb633::operator()
                    ((anon_class_32_4_bbdeb633 *)&ip,iStack_48c,local_490);
        }
      }
      if (Recolor.id._4_4_ != (int)splits.words_[3]) {
        local_498 = Recolor.id._4_4_ - local_450;
        local_49c = 0x7fff;
        piVar3 = CLI::std::min<int>(&local_498,&local_49c);
        local_492 = (short)*piVar3;
        (_hi->field_1).field_3.hint_foldcase_ =
             (_hi->field_1).field_3.hint_foldcase_ | local_492 << 1;
      }
    }
    local_450 = local_450 + -1;
  } while( true );
}

Assistant:

void Prog::ComputeHints(std::vector<Inst>* flat, int begin, int end) {
  Bitmap256 splits;
  int colors[256];

  bool dirty = false;
  for (int id = end; id >= begin; --id) {
    if (id == end ||
        (*flat)[id].opcode() != kInstByteRange) {
      if (dirty) {
        dirty = false;
        splits.Clear();
      }
      splits.Set(255);
      colors[255] = id;
      // At this point, the [0-255] range is colored with id.
      // Thus, hints cannot point beyond id; and if id == end,
      // hints that would have pointed to id will be 0 instead.
      continue;
    }
    dirty = true;

    // We recolor the [lo-hi] range with id. Note that first ratchets backwards
    // from end to the nearest conflict (if any) during recoloring.
    int first = end;
    auto Recolor = [&](int lo, int hi) {
      // Like ByteMapBuilder, we split at lo-1 and at hi.
      --lo;

      if (0 <= lo && !splits.Test(lo)) {
        splits.Set(lo);
        int next = splits.FindNextSetBit(lo+1);
        colors[lo] = colors[next];
      }
      if (!splits.Test(hi)) {
        splits.Set(hi);
        int next = splits.FindNextSetBit(hi+1);
        colors[hi] = colors[next];
      }

      int c = lo+1;
      while (c < 256) {
        int next = splits.FindNextSetBit(c);
        // Ratchet backwards...
        first = std::min(first, colors[next]);
        // Recolor with id - because it's the new nearest conflict!
        colors[next] = id;
        if (next == hi)
          break;
        c = next+1;
      }
    };

    Inst* ip = &(*flat)[id];
    int lo = ip->lo();
    int hi = ip->hi();
    Recolor(lo, hi);
    if (ip->foldcase() && lo <= 'z' && hi >= 'a') {
      int foldlo = lo;
      int foldhi = hi;
      if (foldlo < 'a')
        foldlo = 'a';
      if (foldhi > 'z')
        foldhi = 'z';
      if (foldlo <= foldhi) {
        foldlo += 'A' - 'a';
        foldhi += 'A' - 'a';
        Recolor(foldlo, foldhi);
      }
    }

    if (first != end) {
      uint16_t hint = static_cast<uint16_t>(std::min(first - id, 32767));
      ip->hint_foldcase_ |= hint<<1;
    }
  }
}